

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O3

string * __thiscall Terms::toString_abi_cxx11_(string *__return_storage_ptr__,Terms *this)

{
  Node *this_00;
  Node *pNVar1;
  long *plVar2;
  size_type *psVar3;
  Node *i;
  string *terms;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Terms *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (this->_terms).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar1 = (this->_terms).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  i = this_00 + 1;
  local_58 = this;
  Node::nodeWithNegate_abi_cxx11_(&local_98,this_00);
  if (i != pNVar1) {
    do {
      toString::anon_class_1_0_00000001::operator()
                (&local_78,(anon_class_1_0_00000001 *)&local_50,&local_98,i);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      i = i + 1;
    } while (i != pNVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_98.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_98._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_98._M_string_length;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if (local_58->_negate == true) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::operator+(&local_50,"(",__return_storage_ptr__);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_78.field_2._M_allocated_capacity = *psVar3;
      local_78.field_2._8_8_ = plVar2[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar3;
      local_78._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_78._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string toString() {
    string terms = accumulate(next(begin(this->_terms)), end(this->_terms), this->_terms.begin()->nodeWithNegate(),
      [] (const string& s, const Node& i) {
        return s + " " + i.nodeWithNegate();
      });
    
    if (this->_negate) {
      terms = "(" + terms + ")'";
    }

    return terms;
  }